

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O2

PClassActor * __thiscall AActor::GetBloodType(AActor *this,int type)

{
  int iVar1;
  PClass *pPVar2;
  PClassActor *pPVar3;
  FName *name;
  FName local_c [3];
  
  if (type == 2) {
    pPVar2 = DObject::GetClass((DObject *)this);
    iVar1 = *(int *)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.field_0xa4;
    name = local_c;
  }
  else if (type == 1) {
    pPVar2 = DObject::GetClass((DObject *)this);
    iVar1 = pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index;
    name = local_c + 1;
  }
  else {
    if (type != 0) {
      return (PClassActor *)0x0;
    }
    pPVar2 = DObject::GetClass((DObject *)this);
    iVar1 = *(int *)((long)&pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.Outer + 4);
    name = local_c + 2;
  }
  name->Index = iVar1;
  pPVar3 = PClass::FindActor(name);
  if (pPVar3 == (PClassActor *)0x0) {
    return (PClassActor *)0x0;
  }
  pPVar3 = PClassActor::GetReplacement(pPVar3,true);
  return pPVar3;
}

Assistant:

PClassActor *GetBloodType(int type = 0) const
	{
		PClassActor *bloodcls;
		if (type == 0)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType);
		}
		else if (type == 1)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType2);
		}
		else if (type == 2)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType3);
		}
		else
		{
			return NULL;
		}

		if (bloodcls != NULL)
		{
			bloodcls = bloodcls->GetReplacement();
		}
		return bloodcls;
	}